

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O0

int wally_wif_to_bytes(char *wif,uint32_t prefix,uint32_t flags,uchar *bytes_out,size_t len)

{
  int iVar1;
  size_t local_70;
  size_t uncompressed;
  uchar buf [38];
  int ret;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint32_t prefix_local;
  char *wif_local;
  
  if ((((wif == (char *)0x0) || ((flags & 0xfffffffe) != 0)) || ((prefix & 0xffffff00) != 0)) ||
     ((bytes_out == (uchar *)0x0 || (len != 0x20)))) {
    wif_local._4_4_ = -2;
  }
  else {
    iVar1 = is_uncompressed(wif,(uchar *)&uncompressed,0x26,&local_70);
    if ((((iVar1 == 0) && ((byte)uncompressed == prefix)) && ((local_70 == 0 || (flags == 1)))) &&
       ((local_70 != 0 || (flags == 0)))) {
      *(undefined8 *)bytes_out = stack0xffffffffffffff99;
      *(undefined8 *)(bytes_out + 8) = buf._1_8_;
      *(undefined8 *)(bytes_out + 0x10) = buf._9_8_;
      *(undefined8 *)(bytes_out + 0x18) = buf._17_8_;
      wally_clear(&uncompressed,0x26);
      wif_local._4_4_ = 0;
    }
    else {
      wally_clear(&uncompressed,0x26);
      wif_local._4_4_ = -2;
    }
  }
  return wif_local._4_4_;
}

Assistant:

int wally_wif_to_bytes(const char *wif,
                       uint32_t prefix,
                       uint32_t flags,
                       unsigned char *bytes_out,
                       size_t len)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
    size_t uncompressed;

    if (!wif || (flags & ~WIF_ALL_DEFINED_FLAGS) || (prefix & ~0xff) ||
        !bytes_out || len != EC_PRIVATE_KEY_LEN)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), &uncompressed);

    if (ret != WALLY_OK ||
        (buf[0] != prefix) ||
        (uncompressed && flags != WALLY_WIF_FLAG_UNCOMPRESSED) ||
        (!uncompressed && flags != WALLY_WIF_FLAG_COMPRESSED)) {
        wally_clear(buf, sizeof(buf));
        return WALLY_EINVAL; /** Incorrect format, prefix does not match or inconsistent flag */
    }

    memcpy(bytes_out, &buf[1], EC_PRIVATE_KEY_LEN);

    wally_clear(buf, sizeof(buf));
    return WALLY_OK;
}